

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O3

void __thiscall
Messages::Person_PhoneNumber::InternalSwap(Person_PhoneNumber *this,Person_PhoneNumber *other)

{
  ArenaStringPtr *this_00;
  uint32 uVar1;
  int iVar2;
  ulong uVar3;
  UnknownFieldSet *other_00;
  string *psVar4;
  Arena *arena;
  
  arena = *(Arena **)&this->field_0x8;
  uVar3 = *(ulong *)&other->field_0x8;
  if (((ulong)arena & 1) == 0) {
    if ((uVar3 & 1) != 0) {
LAB_0010869d:
      other_00 = (UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8);
      goto LAB_001086a5;
    }
    uVar1 = (this->_has_bits_).has_bits_[0];
    (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
    (other->_has_bits_).has_bits_[0] = uVar1;
  }
  else {
    if ((uVar3 & 1) != 0) goto LAB_0010869d;
    other_00 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         ((InternalMetadata *)&other->field_0x8);
LAB_001086a5:
    google::protobuf::internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)&this->field_0x8,other_00);
    arena = *(Arena **)&this->field_0x8;
    uVar1 = (this->_has_bits_).has_bits_[0];
    (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
    (other->_has_bits_).has_bits_[0] = uVar1;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
  }
  this_00 = &other->number_;
  psVar4 = (this->number_).ptr_;
  if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    if (this_00->ptr_ ==
        (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
    goto LAB_00108729;
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (&this->number_,arena,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
    psVar4 = (this->number_).ptr_;
  }
  if (this_00->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
  {
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (this_00,arena,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar4);
LAB_00108729:
  iVar2 = this->type_;
  this->type_ = other->type_;
  other->type_ = iVar2;
  return;
}

Assistant:

void Person_PhoneNumber::InternalSwap(Person_PhoneNumber* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  number_.Swap(&other->number_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(type_, other->type_);
}